

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_to_uni(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  wchar_t wVar4;
  vm_obj_id_t obj;
  size_t sVar5;
  int *in_RCX;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t ele_val;
  wchar_t ch;
  size_t i;
  CVmObjList *lst;
  vm_obj_id_t lst_obj;
  size_t charlen;
  uint argc;
  utf8_ptr p;
  long idx;
  size_t bytelen;
  CVmNativeCodeDesc *in_stack_ffffffffffffff58;
  CVmObjList *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff68;
  int iVar6;
  int iVar7;
  utf8_ptr *in_stack_ffffffffffffff70;
  ulong local_78;
  utf8_ptr local_40;
  long local_38;
  size_t local_30;
  int *local_28;
  char *local_20;
  vm_val_t *local_18;
  vm_val_t *local_10;
  
  local_38 = 1;
  local_28 = in_RCX;
  local_20 = (char *)in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  utf8_ptr::utf8_ptr(&local_40);
  if (local_28 == (int *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *local_28;
  }
  iVar7 = iVar6;
  if ((getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_to_uni::desc,0,1);
    __cxa_guard_release(&getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(iVar7,in_stack_ffffffffffffff68),
                     (uint *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (iVar2 == 0) {
    if (iVar6 != 0) {
      iVar3 = CVmBif::pop_long_val();
      local_38 = (long)iVar3;
    }
    CVmStack::push(local_18);
    local_30 = vmb_get_len((char *)0x33a3dd);
    local_20 = (char *)((long)local_20 + 2);
    utf8_ptr::set(&local_40,local_20);
    if (local_38 < 0) {
      sVar5 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58)
      ;
      local_38 = sVar5 + 1 + local_38;
    }
    if (iVar6 == 0) {
      sVar5 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58)
      ;
      obj = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                               (size_t)in_stack_ffffffffffffff58);
      vm_objp(0);
      local_78 = 0;
      while (local_78 < sVar5) {
        wVar4 = utf8_ptr::getch((utf8_ptr *)0x33a51a);
        vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffff70,wVar4);
        CVmObjList::cons_set_element
                  (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,(vm_val_t *)0x33a543)
        ;
        local_78 = local_78 + 1;
        utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
      }
      vm_val_t::set_obj(local_10,obj);
    }
    else {
      while( true ) {
        uVar1 = in_stack_ffffffffffffff68 & 0xffffff;
        if (1 < local_38) {
          uVar1 = CONCAT13(local_30 != 0,(int3)in_stack_ffffffffffffff68);
        }
        in_stack_ffffffffffffff68 = uVar1;
        if ((char)(in_stack_ffffffffffffff68 >> 0x18) == '\0') break;
        local_38 = local_38 + -1;
        utf8_ptr::inc(in_stack_ffffffffffffff70,(size_t *)CONCAT44(iVar7,in_stack_ffffffffffffff68))
        ;
      }
      if ((local_38 == 1) && (local_30 != 0)) {
        wVar4 = utf8_ptr::getch((utf8_ptr *)0x33a4a7);
        vm_val_t::set_int(local_10,wVar4);
      }
      else {
        vm_val_t::set_nil(local_10);
      }
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjString::getp_to_uni(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    size_t bytelen;
    long idx = 1;
    utf8_ptr p;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* retrieve the index argument if present */
    if (argc >= 1)
        idx = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* set up a utf8 pointer to the string */
    p.set((char *)str);

    /* if the index is negative, it's an index from the end of the string */
    if (idx < 0)
        idx += p.len(bytelen) + 1;

    /* check for an index argument */
    if (argc >= 1)
    {
        /* skip through the string until we get to the desired index */
        for ( ; idx > 1 && bytelen != 0 ; --idx, p.inc(&bytelen)) ;

        /* check to see if we have a character available */
        if (idx == 1 && bytelen != 0)
        {
            /* the index is valid - return the character here */
            retval->set_int((long)p.getch());
        }
        else
        {
            /* 
             *   the index is past the end of the string or is less than 1
             *   - return nil to indicate that there's no character here 
             */
            retval->set_nil();
        }
    }
    else
    {
        size_t charlen;
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        size_t i;

        /* 
         *   There's no index argument - they want a list of all of the
         *   code points in the string.  First, get the number of
         *   characters in the string.  
         */
        charlen = p.len(bytelen);

        /* create a list to hold the results */
        lst_obj = CVmObjList::create(vmg_ FALSE, charlen);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list's elements to the unicode characters values */
        for (i = 0 ; i < charlen ; ++i, p.inc())
        {
            wchar_t ch;
            vm_val_t ele_val;

            /* get this character */
            ch = p.getch();

            /* set this list element */
            ele_val.set_int((long)ch);
            lst->cons_set_element(i, &ele_val);
        }

        /* return the list object */
        retval->set_obj(lst_obj);
    }
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}